

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddVariable
          (InstructionBuilder *this,uint32_t type_id,uint32_t storage_class)

{
  IRContext *this_00;
  uint32_t res_id;
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  local_ac = storage_class;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  pIVar1 = (Instruction *)operator_new(0x70);
  this_00 = this->context_;
  res_id = IRContext::TakeNextId(this_00);
  Instruction::Instruction(pIVar1,this_00,OpVariable,type_id,res_id,&operands);
  local_88._0_8_ = pIVar1;
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_88);
  if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return pIVar1;
}

Assistant:

Instruction* AddVariable(uint32_t type_id, uint32_t storage_class) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {storage_class}});
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpVariable, type_id,
                        GetContext()->TakeNextId(), operands));
    return AddInstruction(std::move(new_inst));
  }